

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O1

char * ODDLParser::OpenDDLParser::parsePrimitiveDataType
                 (char *in,char *end,ValueType *type,size_t *len)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  size_t __n;
  char *pcVar5;
  byte *pbVar6;
  uint i;
  long lVar7;
  undefined8 *puVar8;
  
  *type = ddl_none;
  *len = 0;
  if (in != end && in != (char *)0x0) {
    puVar8 = &Grammar::PrimitiveTypeToken;
    lVar7 = 0;
    do {
      pcVar2 = (char *)*puVar8;
      __n = strlen(pcVar2);
      iVar4 = strncmp(in,pcVar2,__n);
      if (iVar4 == 0) {
        *type = (ValueType)lVar7;
        break;
      }
      lVar7 = lVar7 + 1;
      puVar8 = puVar8 + 1;
    } while (lVar7 != 0xe);
    if (*type == ddl_none) {
      pbVar6 = (byte *)in;
      if (in != end) {
        do {
          if (0x2c < (ulong)*pbVar6) {
            return (char *)pbVar6;
          }
          if ((0x100100002600U >> ((ulong)*pbVar6 & 0x3f) & 1) == 0) {
            return (char *)pbVar6;
          }
          pbVar6 = pbVar6 + 1;
          in = end;
        } while (pbVar6 != (byte *)end);
      }
    }
    else {
      pcVar2 = in + __n;
      if (in[__n] == '[') {
        pcVar5 = in + __n + 2;
        do {
          bVar3 = pcVar5 + -1 != end;
          in = end;
          if (pcVar5 + -1 == end) goto LAB_0070879d;
          in = pcVar5 + 1;
          cVar1 = *pcVar5;
          pcVar5 = in;
        } while (cVar1 != ']');
        iVar4 = atoi(pcVar2 + 1);
        *len = (long)iVar4;
        bVar3 = true;
      }
      else {
        *len = 1;
        bVar3 = true;
        in = pcVar2;
      }
LAB_0070879d:
      if (!bVar3) {
        *type = ddl_none;
      }
    }
  }
  return in;
}

Assistant:

char *OpenDDLParser::parsePrimitiveDataType( char *in, char *end, Value::ValueType &type, size_t &len ) {
    type = Value::ddl_none;
    len = 0;
    if( ddl_nullptr == in || in == end ) {
        return in;
    }

    size_t prim_len( 0 );
    for( unsigned int i = 0; i < Value::ddl_types_max; i++ ) {
        prim_len = strlen( Grammar::PrimitiveTypeToken[ i ] );
        if( 0 == strncmp( in, Grammar::PrimitiveTypeToken[ i ], prim_len ) ) {
            type = static_cast<Value::ValueType>( i );
            break;
        }
    }

    if( Value::ddl_none == type ) {
        in = lookForNextToken( in, end );
        return in;
    } else {
        in += prim_len;
    }

    bool ok( true );
    if( *in == Grammar::OpenArrayToken[ 0 ] ) {
        ok = false;
        ++in;
        char *start( in );
        while ( in != end ) {
            ++in;
            if( *in == Grammar::CloseArrayToken[ 0 ] ) {
                len = ::atoi( start );
                ok = true;
                ++in;
                break;
            }
        }
    } else {
        len = 1;
    }
    if( !ok ) {
        type = Value::ddl_none;
    }

    return in;
}